

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

MallocBlock * MallocBlock::Allocate(size_t size,int type)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int *piVar6;
  ThreadCache *heap;
  undefined1 this [8];
  sbyte sVar7;
  size_t sVar8;
  ulong uVar9;
  size_t __len;
  ThreadCachePtr TVar10;
  undefined1 local_68 [8];
  void *rv;
  int local_3c;
  uint local_38;
  char local_31;
  
  if (Allocate::max_size_t - 0x30 < size) {
    RAW_LOG(-3,"Massive size passed to malloc: %zu",size);
    return (MallocBlock *)0x0;
  }
  local_31 = FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence;
  local_3c = type;
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence ==
      '\x01') {
    local_38 = (uint)FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::
                     FLAGS_malloc_page_fence_readable;
    uVar9 = size + 0x2f & 0xfffffffffffffff0;
    iVar3 = getpagesize();
    __len = (size_t)iVar3;
    iVar4 = (int)(((uVar9 + __len) - 1) / __len);
    pvVar5 = mmap((void *)0x0,(long)(iVar3 * (iVar4 + 1)),3,0x22,-1,0);
    if (pvVar5 == (void *)0xffffffffffffffff) {
      piVar6 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError((SafeStrError *)local_68,*piVar6);
      RAW_LOG(-4,"Out of memory: possibly due to page fence overhead: %s",local_68);
    }
    pvVar5 = (void *)((long)pvVar5 + (long)(iVar4 * iVar3));
    iVar3 = mprotect(pvVar5,__len,local_38);
    if (iVar3 != 0) {
      piVar6 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError((SafeStrError *)local_68,*piVar6);
      RAW_LOG(-4,"Guard page setup failed: %s",local_68);
    }
    this = (undefined1  [8])((long)pvVar5 - uVar9);
  }
  else {
    uVar9 = size + 0x30;
    TVar10 = tcmalloc::ThreadCachePtr::Grab();
    heap = TVar10.ptr_;
    if (uVar9 < 0x401) {
      sVar7 = 3;
      iVar3 = 7;
    }
    else {
      if (0x40000 < uVar9) {
        this = (undefined1  [8])anon_unknown.dwarf_5263::do_malloc_pages(heap,uVar9);
        goto LAB_00118991;
      }
      sVar7 = 7;
      iVar3 = 0x3c7f;
    }
    bVar1 = (&tcmalloc::Static::sizemap_)[(uint)(iVar3 + (int)uVar9) >> sVar7];
    iVar3 = (&DAT_001430c4)[bVar1];
    bVar2 = tcmalloc::ThreadCache::SampleAllocation(heap,(long)iVar3);
    if (bVar2) {
      this = (undefined1  [8])DoSampledAllocation(uVar9);
    }
    else {
      bVar2 = tcmalloc::ThreadCache::FreeList::TryPop(heap->list_ + bVar1,(void **)local_68);
      if (bVar2) {
        heap->size_ = heap->size_ - iVar3;
        this = local_68;
      }
      else {
        this = (undefined1  [8])
               tcmalloc::ThreadCache::FetchFromCentralCache
                         (heap,(uint)bVar1,iVar3,anon_unknown.dwarf_5263::nop_oom_handler);
      }
    }
  }
LAB_00118991:
  if (this == (undefined1  [8])0x0) {
    this = (undefined1  [8])0x0;
  }
  else {
    sVar8 = 0xdeadbeef;
    if (local_31 != '\0') {
      sVar8 = 0xabcdefab;
    }
    ((MallocBlock *)this)->magic1_ = sVar8;
    Initialize((MallocBlock *)this,size,local_3c);
  }
  return (MallocBlock *)this;
}

Assistant:

static MallocBlock* Allocate(size_t size, int type) {
    // Prevent an integer overflow / crash with large allocation sizes.
    // TODO - Note that for a e.g. 64-bit size_t, max_size_t may not actually
    // be the maximum value, depending on how the compiler treats ~0. The worst
    // practical effect is that allocations are limited to 4Gb or so, even if
    // the address space could take more.
    static size_t max_size_t = ~0;
    if (size > max_size_t - sizeof(MallocBlock)) {
      RAW_LOG(ERROR, "Massive size passed to malloc: %zu", size);
      return nullptr;
    }
    MallocBlock* b = nullptr;
    const bool use_malloc_page_fence = FLAGS_malloc_page_fence;
    const bool malloc_page_fence_readable = FLAGS_malloc_page_fence_readable;
#ifdef HAVE_MMAP
    if (use_malloc_page_fence) {
      // Put the block towards the end of the page and make the next page
      // inaccessible. This will catch buffer overrun right when it happens.
      size_t sz = real_mmapped_size(size);
      int pagesize = getpagesize();
      int num_pages = (sz + pagesize - 1) / pagesize + 1;
      char* p = (char*) mmap(nullptr, num_pages * pagesize, PROT_READ|PROT_WRITE,
                             MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
      if (p == MAP_FAILED) {
        // If the allocation fails, abort rather than returning nullptr to
        // malloc. This is because in most cases, the program will run out
        // of memory in this mode due to tremendous amount of wastage. There
        // is no point in propagating the error elsewhere.
        RAW_LOG(FATAL, "Out of memory: possibly due to page fence overhead: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      // Mark the page after the block inaccessible
      if (mprotect(p + (num_pages - 1) * pagesize, pagesize,
                   PROT_NONE|(malloc_page_fence_readable ? PROT_READ : 0))) {
        RAW_LOG(FATAL, "Guard page setup failed: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      b = (MallocBlock*) (p + (num_pages - 1) * pagesize - sz);
    } else {
      b = (MallocBlock*) do_malloc(real_malloced_size(size));
    }
#else
    b = (MallocBlock*) do_malloc(real_malloced_size(size));
#endif

    // It would be nice to output a diagnostic on allocation failure
    // here, but logging (other than FATAL) requires allocating
    // memory, which could trigger a nasty recursion. Instead, preserve
    // malloc semantics and return nullptr on failure.
    if (b != nullptr) {
      b->magic1_ = use_malloc_page_fence ? kMagicMMap : kMagicMalloc;
      b->Initialize(size, type);
    }
    return b;
  }